

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O1

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->overview_)._M_dataplus._M_p;
  paVar1 = &(this->overview_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->program_name_)._M_dataplus._M_p;
  paVar1 = &(this->program_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  option::~option(&this->super_option);
  return;
}

Assistant:

~help () override = default;